

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

string * __thiscall
kratos::SystemVerilogCodeGen::get_width_str_abi_cxx11_
          (string *__return_storage_ptr__,SystemVerilogCodeGen *this,uint32_t width)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  ulong local_28 [3];
  
  local_28[0] = (ulong)((int)this - 1);
  format_str.size_ = 2;
  format_str.data_ = (char *)0x7;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_28;
  fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,(detail *)"[{0}:0]",format_str,args);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemVerilogCodeGen::get_width_str(uint32_t width) {
    return ::format("[{0}:0]", width - 1);
}